

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow::Funcs::NodeWindows(ImVector<ImGuiWindow_*> *windows,char *label)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  int i;
  
  bVar1 = TreeNode(label,"%s (%d)",label,(ulong)(uint)windows->Size);
  if (bVar1) {
    Text("(In front-to-back order:)");
    i = windows->Size;
    while (0 < i) {
      i = i + -1;
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](windows,i);
      PushID(*ppIVar2);
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](windows,i);
      NodeWindow(*ppIVar2,"Window");
      PopID();
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            ImGui::Text("(In front-to-back order:)");
            for (int i = windows.Size - 1; i >= 0; i--) // Iterate front to back
            {
                ImGui::PushID(windows[i]);
                Funcs::NodeWindow(windows[i], "Window");
                ImGui::PopID();
            }
            ImGui::TreePop();
        }